

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

int ON_Texture::Compare(ON_Texture *a,ON_Texture *b)

{
  double dVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  ON_wString *this;
  ON_wString *this_00;
  wchar_t *other_path;
  
  iVar3 = ON_UuidCompare(&a->m_texture_id,&b->m_texture_id);
  if (iVar3 != 0) {
    return iVar3;
  }
  uVar4 = 0xffffffff;
  if (b->m_mapping_channel_id <= a->m_mapping_channel_id) {
    uVar4 = (uint)(b->m_mapping_channel_id < a->m_mapping_channel_id);
  }
  if (uVar4 != 0) {
    return uVar4;
  }
  this = ON_FileReference::FullPath(&a->m_image_file_reference);
  this_00 = ON_FileReference::FullPath(&b->m_image_file_reference);
  other_path = ON_wString::operator_cast_to_wchar_t_(this_00);
  iVar3 = ON_wString::ComparePath(this,other_path);
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = (uint)a->m_bOn - (uint)b->m_bOn;
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = a->m_type - b->m_type;
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = a->m_mode - b->m_mode;
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = a->m_minfilter - b->m_minfilter;
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = a->m_magfilter - b->m_magfilter;
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = a->m_wrapu - b->m_wrapu;
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = a->m_wrapv - b->m_wrapv;
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = a->m_wrapw - b->m_wrapw;
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = CompareXform(&a->m_uvw,&b->m_uvw);
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = ON_Color::Compare(&a->m_border_color,&b->m_border_color);
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = ON_Color::Compare(&a->m_transparent_color,&b->m_transparent_color);
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = ON_Interval::Compare(&a->m_bump_scale,&b->m_bump_scale);
  if (iVar3 != 0) {
    return iVar3;
  }
  dVar1 = a->m_blend_constant_A;
  dVar2 = b->m_blend_constant_A;
  if (dVar1 < dVar2) {
    return -1;
  }
  if (dVar2 < dVar1) {
    return 1;
  }
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    if (NAN(dVar1)) {
      if (!NAN(dVar2)) {
        return -1;
      }
    }
    else if (NAN(dVar2)) {
      return -1;
    }
  }
  dVar1 = a->m_blend_A0;
  dVar2 = b->m_blend_A0;
  if (dVar1 < dVar2) {
    return -1;
  }
  if (dVar2 < dVar1) {
    return 1;
  }
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    if (NAN(dVar1)) {
      if (!NAN(dVar2)) {
        return -1;
      }
    }
    else if (NAN(dVar2)) {
      return -1;
    }
  }
  dVar1 = a->m_blend_A1;
  dVar2 = b->m_blend_A1;
  if (dVar1 < dVar2) {
    return -1;
  }
  if (dVar2 < dVar1) {
    return 1;
  }
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    if (NAN(dVar1)) {
      if (!NAN(dVar2)) {
        return -1;
      }
    }
    else if (NAN(dVar2)) {
      return -1;
    }
  }
  dVar1 = a->m_blend_A2;
  dVar2 = b->m_blend_A2;
  if (dVar1 < dVar2) {
    return -1;
  }
  if (dVar2 < dVar1) {
    return 1;
  }
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    if (NAN(dVar1)) {
      if (!NAN(dVar2)) {
        return -1;
      }
    }
    else if (NAN(dVar2)) {
      return -1;
    }
  }
  dVar1 = a->m_blend_A3;
  dVar2 = b->m_blend_A3;
  if (dVar1 < dVar2) {
    return -1;
  }
  if (dVar2 < dVar1) {
    return 1;
  }
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    if (NAN(dVar1)) {
      if (!NAN(dVar2)) {
        return -1;
      }
    }
    else if (NAN(dVar2)) {
      return -1;
    }
  }
  dVar1 = a->m_blend_RGB0;
  dVar2 = b->m_blend_RGB0;
  if (dVar1 < dVar2) {
    return -1;
  }
  if (dVar2 < dVar1) {
    return 1;
  }
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    if (NAN(dVar1)) {
      if (!NAN(dVar2)) {
        return -1;
      }
    }
    else if (NAN(dVar2)) {
      return -1;
    }
  }
  dVar1 = a->m_blend_RGB1;
  dVar2 = b->m_blend_RGB1;
  if (dVar1 < dVar2) {
    return -1;
  }
  if (dVar2 < dVar1) {
    return 1;
  }
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    if (NAN(dVar1)) {
      if (!NAN(dVar2)) {
        return -1;
      }
    }
    else if (NAN(dVar2)) {
      return -1;
    }
  }
  dVar1 = a->m_blend_RGB2;
  dVar2 = b->m_blend_RGB2;
  if (dVar1 < dVar2) {
    return -1;
  }
  if (dVar2 < dVar1) {
    return 1;
  }
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    if (NAN(dVar1)) {
      if (!NAN(dVar2)) {
        return -1;
      }
    }
    else if (NAN(dVar2)) {
      return -1;
    }
  }
  dVar1 = a->m_blend_RGB3;
  dVar2 = b->m_blend_RGB3;
  if (dVar1 < dVar2) {
    return -1;
  }
  if (dVar2 < dVar1) {
    return 1;
  }
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    if (NAN(dVar1)) {
      if (!NAN(dVar2)) {
        return -1;
      }
    }
    else if (NAN(dVar2)) {
      return -1;
    }
  }
  return (uint)a->m_bTreatAsLinear - (uint)b->m_bTreatAsLinear;
}

Assistant:

int ON_Texture::Compare(const ON_Texture& a, const ON_Texture& b)
{
  int rc = ON_UuidCompare(&a.m_texture_id, &b.m_texture_id);
  while (!rc)
  {
    if (a.m_mapping_channel_id < b.m_mapping_channel_id)
      rc = -1;
    else if (a.m_mapping_channel_id > b.m_mapping_channel_id)
      rc = 1;
    if (rc) break;

    rc = a.m_image_file_reference.FullPath().ComparePath(static_cast< const wchar_t* >(b.m_image_file_reference.FullPath()));
    if (rc) break;

    rc = ((int)(a.m_bOn ? 1 : 0)) - ((int)(b.m_bOn ? 1 : 0));
    if (rc) break;

    rc = ((int)a.m_type) - ((int)b.m_type);
    if (rc) break;

    rc = ((int)a.m_mode) - ((int)b.m_mode);
    if (rc) break;

    rc = ((int)a.m_minfilter) - ((int)b.m_minfilter);
    if (rc) break;

    rc = ((int)a.m_magfilter) - ((int)b.m_magfilter);
    if (rc) break;

    rc = ((int)a.m_wrapu) - ((int)b.m_wrapu);
    if (rc) break;

    rc = ((int)a.m_wrapv) - ((int)b.m_wrapv);
    if (rc) break;

    rc = ((int)a.m_wrapw) - ((int)b.m_wrapw);
    if (rc) break;

    rc = CompareXform(a.m_uvw, b.m_uvw);
    if (rc) break;

    rc = a.m_border_color.Compare(b.m_border_color);
    if (rc) break;

    rc = a.m_transparent_color.Compare(b.m_transparent_color);
    if (rc) break;

    rc = ON_Interval::Compare(a.m_bump_scale, b.m_bump_scale);
    if (rc) break;

    rc = CompareDouble(a.m_blend_constant_A, b.m_blend_constant_A);
    if (rc) break;

    rc = CompareDouble(a.m_blend_A0, b.m_blend_A0);
    if (rc) break;
    rc = CompareDouble(a.m_blend_A1, b.m_blend_A1);
    if (rc) break;
    rc = CompareDouble(a.m_blend_A2, b.m_blend_A2);
    if (rc) break;
    rc = CompareDouble(a.m_blend_A3, b.m_blend_A3);
    if (rc) break;

    rc = CompareDouble(a.m_blend_RGB0, b.m_blend_RGB0);
    if (rc) break;
    rc = CompareDouble(a.m_blend_RGB1, b.m_blend_RGB1);
    if (rc) break;
    rc = CompareDouble(a.m_blend_RGB2, b.m_blend_RGB2);
    if (rc) break;
    rc = CompareDouble(a.m_blend_RGB3, b.m_blend_RGB3);
    if (rc) break;

    rc = ((int)(a.m_bTreatAsLinear ? 1 : 0)) - ((int)(b.m_bTreatAsLinear ? 1 : 0));
    if (rc) break;

    break;
  }

  return rc;
}